

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__vertical_scatter_with_5_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float *pfVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  
  pfVar23 = *outputs;
  pfVar26 = outputs[1];
  fVar2 = *vertical_coefficients;
  fVar3 = vertical_coefficients[1];
  pfVar27 = outputs[2];
  fVar4 = vertical_coefficients[2];
  pfVar28 = outputs[3];
  fVar5 = vertical_coefficients[3];
  pfVar25 = outputs[4];
  fVar6 = vertical_coefficients[4];
  for (lVar24 = (long)input_end - (long)input; 0x3f < lVar24; lVar24 = lVar24 + -0x40) {
    fVar7 = *input;
    fVar8 = input[1];
    fVar9 = input[2];
    fVar10 = input[3];
    fVar11 = input[4];
    fVar12 = input[5];
    fVar13 = input[6];
    fVar14 = input[7];
    fVar15 = input[8];
    fVar16 = input[9];
    fVar17 = input[10];
    fVar18 = input[0xb];
    fVar19 = input[0xc];
    fVar20 = input[0xd];
    fVar21 = input[0xe];
    fVar22 = input[0xf];
    *pfVar23 = fVar2 * fVar7 + *pfVar23;
    pfVar23[1] = fVar2 * fVar8 + pfVar23[1];
    pfVar23[2] = fVar2 * fVar9 + pfVar23[2];
    pfVar23[3] = fVar2 * fVar10 + pfVar23[3];
    pfVar23[4] = fVar2 * fVar11 + pfVar23[4];
    pfVar23[5] = fVar2 * fVar12 + pfVar23[5];
    pfVar23[6] = fVar2 * fVar13 + pfVar23[6];
    pfVar23[7] = fVar2 * fVar14 + pfVar23[7];
    pfVar23[8] = fVar2 * fVar15 + pfVar23[8];
    pfVar23[9] = fVar2 * fVar16 + pfVar23[9];
    pfVar23[10] = fVar2 * fVar17 + pfVar23[10];
    pfVar23[0xb] = fVar2 * fVar18 + pfVar23[0xb];
    pfVar23[0xc] = fVar2 * fVar19 + pfVar23[0xc];
    pfVar23[0xd] = fVar2 * fVar20 + pfVar23[0xd];
    pfVar23[0xe] = fVar2 * fVar21 + pfVar23[0xe];
    pfVar23[0xf] = fVar2 * fVar22 + pfVar23[0xf];
    *pfVar26 = fVar3 * fVar7 + *pfVar26;
    pfVar26[1] = fVar3 * fVar8 + pfVar26[1];
    pfVar26[2] = fVar3 * fVar9 + pfVar26[2];
    pfVar26[3] = fVar3 * fVar10 + pfVar26[3];
    pfVar26[4] = fVar3 * fVar11 + pfVar26[4];
    pfVar26[5] = fVar3 * fVar12 + pfVar26[5];
    pfVar26[6] = fVar3 * fVar13 + pfVar26[6];
    pfVar26[7] = fVar3 * fVar14 + pfVar26[7];
    pfVar26[8] = fVar3 * fVar15 + pfVar26[8];
    pfVar26[9] = fVar3 * fVar16 + pfVar26[9];
    pfVar26[10] = fVar3 * fVar17 + pfVar26[10];
    pfVar26[0xb] = fVar3 * fVar18 + pfVar26[0xb];
    pfVar26[0xc] = fVar3 * fVar19 + pfVar26[0xc];
    pfVar26[0xd] = fVar3 * fVar20 + pfVar26[0xd];
    pfVar26[0xe] = fVar3 * fVar21 + pfVar26[0xe];
    pfVar26[0xf] = fVar3 * fVar22 + pfVar26[0xf];
    *pfVar27 = fVar4 * fVar7 + *pfVar27;
    pfVar27[1] = fVar4 * fVar8 + pfVar27[1];
    pfVar27[2] = fVar4 * fVar9 + pfVar27[2];
    pfVar27[3] = fVar4 * fVar10 + pfVar27[3];
    pfVar27[4] = fVar4 * fVar11 + pfVar27[4];
    pfVar27[5] = fVar4 * fVar12 + pfVar27[5];
    pfVar27[6] = fVar4 * fVar13 + pfVar27[6];
    pfVar27[7] = fVar4 * fVar14 + pfVar27[7];
    pfVar27[8] = fVar4 * fVar15 + pfVar27[8];
    pfVar27[9] = fVar4 * fVar16 + pfVar27[9];
    pfVar27[10] = fVar4 * fVar17 + pfVar27[10];
    pfVar27[0xb] = fVar4 * fVar18 + pfVar27[0xb];
    pfVar27[0xc] = fVar4 * fVar19 + pfVar27[0xc];
    pfVar27[0xd] = fVar4 * fVar20 + pfVar27[0xd];
    pfVar27[0xe] = fVar4 * fVar21 + pfVar27[0xe];
    pfVar27[0xf] = fVar4 * fVar22 + pfVar27[0xf];
    *pfVar28 = fVar5 * fVar7 + *pfVar28;
    pfVar28[1] = fVar5 * fVar8 + pfVar28[1];
    pfVar28[2] = fVar5 * fVar9 + pfVar28[2];
    pfVar28[3] = fVar5 * fVar10 + pfVar28[3];
    pfVar28[4] = fVar5 * fVar11 + pfVar28[4];
    pfVar28[5] = fVar5 * fVar12 + pfVar28[5];
    pfVar28[6] = fVar5 * fVar13 + pfVar28[6];
    pfVar28[7] = fVar5 * fVar14 + pfVar28[7];
    pfVar28[8] = fVar5 * fVar15 + pfVar28[8];
    pfVar28[9] = fVar5 * fVar16 + pfVar28[9];
    pfVar28[10] = fVar5 * fVar17 + pfVar28[10];
    pfVar28[0xb] = fVar5 * fVar18 + pfVar28[0xb];
    pfVar28[0xc] = fVar5 * fVar19 + pfVar28[0xc];
    pfVar28[0xd] = fVar5 * fVar20 + pfVar28[0xd];
    pfVar28[0xe] = fVar5 * fVar21 + pfVar28[0xe];
    pfVar28[0xf] = fVar5 * fVar22 + pfVar28[0xf];
    *pfVar25 = fVar7 * fVar6 + *pfVar25;
    pfVar25[1] = fVar8 * fVar6 + pfVar25[1];
    pfVar25[2] = fVar9 * fVar6 + pfVar25[2];
    pfVar25[3] = fVar10 * fVar6 + pfVar25[3];
    pfVar25[4] = fVar11 * fVar6 + pfVar25[4];
    pfVar25[5] = fVar12 * fVar6 + pfVar25[5];
    pfVar25[6] = fVar13 * fVar6 + pfVar25[6];
    pfVar25[7] = fVar14 * fVar6 + pfVar25[7];
    input = input + 0x10;
    pfVar25[8] = fVar15 * fVar6 + pfVar25[8];
    pfVar25[9] = fVar16 * fVar6 + pfVar25[9];
    pfVar25[10] = fVar17 * fVar6 + pfVar25[10];
    pfVar25[0xb] = fVar18 * fVar6 + pfVar25[0xb];
    pfVar23 = pfVar23 + 0x10;
    pfVar26 = pfVar26 + 0x10;
    pfVar27 = pfVar27 + 0x10;
    pfVar25[0xc] = fVar19 * fVar6 + pfVar25[0xc];
    pfVar25[0xd] = fVar20 * fVar6 + pfVar25[0xd];
    pfVar25[0xe] = fVar21 * fVar6 + pfVar25[0xe];
    pfVar25[0xf] = fVar22 * fVar6 + pfVar25[0xf];
    pfVar28 = pfVar28 + 0x10;
    pfVar25 = pfVar25 + 0x10;
  }
  if (0xf < lVar24) {
    lVar24 = (long)input_end - (long)input;
    do {
      fVar7 = *input;
      fVar8 = input[1];
      fVar9 = input[2];
      fVar10 = input[3];
      *pfVar23 = fVar2 * fVar7 + *pfVar23;
      pfVar23[1] = fVar2 * fVar8 + pfVar23[1];
      pfVar23[2] = fVar2 * fVar9 + pfVar23[2];
      pfVar23[3] = fVar2 * fVar10 + pfVar23[3];
      *pfVar26 = fVar3 * fVar7 + *pfVar26;
      pfVar26[1] = fVar3 * fVar8 + pfVar26[1];
      pfVar26[2] = fVar3 * fVar9 + pfVar26[2];
      pfVar26[3] = fVar3 * fVar10 + pfVar26[3];
      *pfVar27 = fVar4 * fVar7 + *pfVar27;
      pfVar27[1] = fVar4 * fVar8 + pfVar27[1];
      pfVar27[2] = fVar4 * fVar9 + pfVar27[2];
      pfVar27[3] = fVar4 * fVar10 + pfVar27[3];
      *pfVar28 = fVar5 * fVar7 + *pfVar28;
      pfVar28[1] = fVar5 * fVar8 + pfVar28[1];
      pfVar28[2] = fVar5 * fVar9 + pfVar28[2];
      pfVar28[3] = fVar5 * fVar10 + pfVar28[3];
      *pfVar25 = fVar7 * fVar6 + *pfVar25;
      pfVar25[1] = fVar8 * fVar6 + pfVar25[1];
      pfVar25[2] = fVar9 * fVar6 + pfVar25[2];
      pfVar25[3] = fVar10 * fVar6 + pfVar25[3];
      input = input + 4;
      pfVar23 = pfVar23 + 4;
      pfVar26 = pfVar26 + 4;
      pfVar27 = pfVar27 + 4;
      pfVar28 = pfVar28 + 4;
      pfVar25 = pfVar25 + 4;
      lVar24 = lVar24 + -0x10;
    } while (0xf < lVar24);
  }
  if (input < input_end) {
    lVar24 = 0;
    do {
      pfVar1 = (float *)((long)input + lVar24);
      fVar7 = *pfVar1;
      *(float *)((long)pfVar23 + lVar24) = fVar2 * fVar7 + *(float *)((long)pfVar23 + lVar24);
      *(float *)((long)pfVar26 + lVar24) = fVar3 * fVar7 + *(float *)((long)pfVar26 + lVar24);
      *(float *)((long)pfVar27 + lVar24) = fVar4 * fVar7 + *(float *)((long)pfVar27 + lVar24);
      *(float *)((long)pfVar28 + lVar24) = fVar5 * fVar7 + *(float *)((long)pfVar28 + lVar24);
      *(float *)((long)pfVar25 + lVar24) = fVar7 * fVar6 + *(float *)((long)pfVar25 + lVar24);
      lVar24 = lVar24 + 4;
    } while (pfVar1 + 1 < input_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}